

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O2

void DepParserTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  vw *pvVar7;
  uint uVar8;
  undefined8 *__s;
  typed_option<unsigned_long> *op;
  typed_option<unsigned_int> *ptVar9;
  example *this;
  undefined **ppuVar10;
  char **ppcVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  byte bVar13;
  allocator_type local_299;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  vw *local_260;
  char *triple [12];
  char *local_1f8;
  bool *local_1f0;
  char *pair [19];
  char *local_150;
  option_group_definition new_options;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar13 = 0;
  local_260 = Search::search::get_vw_pointer_unsafe(sch);
  __s = (undefined8 *)operator_new(0x2c8);
  memset(__s,0,0x2c8);
  v_array<unsigned_int>::resize((v_array<unsigned_int> *)(__s + 7),5);
  *__s = 0;
  sch->task_data = __s;
  std::__cxx11::string::string((string *)&local_50,"Dependency Parser Options",(allocator *)pair);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"root_label",(allocator *)&local_278);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)pair,&local_70,__s + 1);
  pair[0xe]._0_1_ = 1;
  op = VW::config::typed_option<unsigned_long>::default_value((typed_option<unsigned_long> *)pair,8)
  ;
  std::__cxx11::string::string
            ((string *)triple,"Ensure that there is only one root in each sentence",
             (allocator *)&local_298);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&new_options,op);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)pair);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_90,"num_label",(allocator *)&local_278);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)pair,&local_90,(uint *)(__s + 2));
  pair[0xe]._0_1_ = 1;
  ptVar9 = VW::config::typed_option<unsigned_int>::default_value
                     ((typed_option<unsigned_int> *)pair,0xc);
  std::__cxx11::string::string((string *)triple,"Number of arc labels",(allocator *)&local_298);
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&new_options,ptVar9);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)pair);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,"transition_system",(allocator *)&local_278);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)pair,&local_b0,(uint *)((long)__s + 0x2c4));
  pair[0xe]._0_1_ = 1;
  ptVar9 = VW::config::typed_option<unsigned_int>::default_value
                     ((typed_option<unsigned_int> *)pair,1);
  std::__cxx11::string::string
            ((string *)triple,"1: arc-hybrid 2: arc-eager",(allocator *)&local_298);
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&new_options,ptVar9);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)pair);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"one_learner",(allocator *)&local_278);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)pair,&local_d0,(bool *)((long)__s + 0x2c2));
  pair[0xe]._0_1_ = 1;
  std::__cxx11::string::string
            ((string *)triple,"Using one learner instead of three learners for labeled parser",
             (allocator *)&local_298);
  std::__cxx11::string::_M_assign((string *)(pair + 6));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"cost_to_go",(allocator *)&local_278);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)pair,&local_f0,(bool *)((long)__s + 0x2c1));
  pair[0xe]._0_1_ = 1;
  std::__cxx11::string::string
            ((string *)triple,
             "Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out",
             (allocator *)&local_298);
  std::__cxx11::string::_M_assign((string *)(pair + 6));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110,"old_style_labels",(allocator *)&local_278);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)pair,&local_110,(bool *)(__s + 0x58));
  pair[0xe]._0_1_ = 1;
  local_1f0 = (bool *)((long)__s + 0x2c1);
  std::__cxx11::string::string
            ((string *)triple,"Use old hack of label information",(allocator *)&local_298);
  std::__cxx11::string::_M_assign((string *)(pair + 6));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)&local_110);
  (**options->_vptr_options_i)(options,&new_options);
  this = VW::alloc_examples(0x28,1);
  *__s = this;
  pair[0]._0_1_ = 'd';
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this,(uchar *)pair);
  pvVar7 = local_260;
  for (lVar12 = -0xd; lVar12 != 0; lVar12 = lVar12 + 1) {
    pair[0]._0_1_ = (char)lVar12 + 'O';
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)*__s,(uchar *)pair);
  }
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)*__s,&constant_namespace);
  Search::search::set_num_learners(sch,(ulong)(*(bool *)((long)__s + 0x2c2) ^ 1) * 2 + 1);
  memcpy(pair,&PTR_anon_var_dwarf_6f4aff_002b2b30,0x98);
  ppuVar10 = &PTR_anon_var_dwarf_6f4bde_002b2bd0;
  ppcVar11 = triple;
  for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
    *ppcVar11 = *ppuVar10;
    ppuVar10 = ppuVar10 + (ulong)bVar13 * -2 + 1;
    ppcVar11 = ppcVar11 + (ulong)bVar13 * -2 + 1;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,pair,
             &local_150,(allocator_type *)&local_298);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,triple,
             &local_1f8,&local_299);
  pbVar1 = (pvVar7->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar7->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar3 = (pvVar7->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pvVar7->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar7->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pvVar7->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (pvVar7->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar7->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_298.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar5 = (pvVar7->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (pvVar7->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar7->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_298.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pvVar7->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_298.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &local_260->interactions;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar5;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar3;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (pvVar7->interactions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pvVar7->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pvVar7->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (pvVar7->interactions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pvVar7->triples).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pvVar7->triples).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar8 = 0;
  if (*local_1f0 != false) {
    uVar8 = Search::ACTION_COSTS;
  }
  Search::search::set_options(sch,Search::NO_CACHING | Search::AUTO_CONDITION_FEATURES | uVar8);
  Search::search::set_label_parser
            (sch,(label_parser *)&COST_SENSITIVE::cs_label,
             initialize::anon_class_1_0_00000001::__invoke);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search &sch, size_t & /*num_actions*/, options_i &options)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = new task_data();
  data->action_loss.resize(5);
  data->ex = NULL;
  sch.set_task_data<task_data>(data);

  option_group_definition new_options("Dependency Parser Options");
  new_options.add(make_option("root_label", data->root_label)
                      .keep()
                      .default_value(8)
                      .help("Ensure that there is only one root in each sentence"));
  new_options.add(make_option("num_label", data->num_label).keep().default_value(12).help("Number of arc labels"));
  new_options.add(make_option("transition_system", data->transition_system)
                      .keep()
                      .default_value(1)
                      .help("1: arc-hybrid 2: arc-eager"));
  new_options.add(make_option("one_learner", data->one_learner)
                      .keep()
                      .help("Using one learner instead of three learners for labeled parser"));
  new_options.add(make_option("cost_to_go", data->cost_to_go)
                      .keep()
                      .help("Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out"));
  new_options.add(
      make_option("old_style_labels", data->old_style_labels).keep().help("Use old hack of label information"));
  options.add_and_parse(new_options);

  data->ex = VW::alloc_examples(sizeof(polylabel), 1);
  data->ex->indices.push_back(val_namespace);
  for (size_t i = 1; i < 14; i++) data->ex->indices.push_back((unsigned char)i + 'A');
  data->ex->indices.push_back(constant_namespace);

  if (data->one_learner)
    sch.set_num_learners(1);
  else
    sch.set_num_learners(3);

  const char *pair[] = {
      "BC", "BE", "BB", "CC", "DD", "EE", "FF", "GG", "EF", "BH", "BJ", "EL", "dB", "dC", "dD", "dE", "dF", "dG", "dd"};
  const char *triple[] = {"EFG", "BEF", "BCE", "BCD", "BEL", "ELM", "BHI", "BCC", "BEJ", "BEH", "BJK", "BEN"};
  vector<string> newpairs(pair, pair + 19);
  vector<string> newtriples(triple, triple + 12);
  all.pairs.swap(newpairs);
  all.triples.swap(newtriples);

  all.interactions.clear();
  all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
  all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
  if (data->cost_to_go)
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING | ACTION_COSTS);
  else
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING);

  sch.set_label_parser(COST_SENSITIVE::cs_label, [](polylabel &l) -> bool { return l.cs.costs.size() == 0; });
}